

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall BBDT<UFPC>::PerformLabeling(BBDT<UFPC> *this)

{
  undefined8 uVar1;
  char cVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int r;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint local_c0;
  Size local_98;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar9 = (long)*(int *)&pMVar3->field_0x8;
  lVar18 = (long)*(int *)&pMVar3->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar3->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar3->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UFPC::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  for (uVar12 = 0; (long)uVar12 < lVar9; uVar12 = uVar12 + 2) {
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar10 = **(long **)&pMVar3->field_0x48;
    lVar11 = lVar10 * uVar12 + *(long *)&pMVar3->field_0x10;
    lVar19 = lVar11 - lVar10;
    lVar14 = lVar19 - lVar10;
    lVar16 = **(long **)&pMVar4->field_0x48;
    lVar20 = lVar16 * uVar12 + *(long *)&pMVar4->field_0x10;
    lVar10 = lVar10 + lVar11;
    lVar16 = lVar20 + lVar16 * -2;
    uVar17 = uVar12 | 1;
    for (uVar21 = 0; (long)uVar21 < lVar18; uVar21 = uVar21 + 2) {
      if (*(char *)(lVar11 + uVar21) == '\0') {
        if (((long)uVar17 < lVar9) && (*(char *)(lVar10 + uVar21) != '\0')) {
          uVar8 = uVar21 | 1;
          if ((lVar18 <= (long)uVar8) || (*(char *)(lVar11 + uVar8) == '\0')) {
            if ((uVar21 != 0) &&
               ((*(char *)((uVar21 - 1) + lVar10) != '\0' ||
                (*(char *)(lVar11 + -1 + uVar21) != '\0')))) goto LAB_00183a35;
            goto LAB_001837a3;
          }
          if (uVar21 == 0) {
LAB_0018349b:
            if (uVar12 == 0) goto LAB_001837a3;
            if (*(char *)(lVar19 + (uVar21 | 1)) == '\0') {
              if (((long)(uVar21 + 2) < lVar18) && (*(char *)(lVar19 + uVar21 + 2) != '\0')) {
                if (*(char *)(lVar19 + uVar21) == '\0') goto LAB_00183861;
                goto LAB_0018364c;
              }
              if (*(char *)(lVar19 + uVar21) == '\0') goto LAB_001837a3;
            }
            goto LAB_0018379a;
          }
          if (*(char *)((uVar21 - 1) + lVar11) != '\0') {
            if (uVar12 != 0) {
              if (*(char *)(lVar19 + uVar8) != '\0') goto LAB_001833d0;
              if (((long)(uVar21 + 2) < lVar18) && (*(char *)(lVar19 + uVar21 + 2) != '\0')) {
                if (*(char *)(lVar14 + uVar8) == '\0') {
                  uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                  goto LAB_001839eb;
                }
                if (*(char *)(lVar19 + uVar21) == '\0') goto LAB_00183526;
LAB_00183901:
                uVar7 = *(uint *)(lVar20 + -8 + uVar21 * 4);
LAB_00183a04:
                *(uint *)(lVar20 + uVar21 * 4) = uVar7;
                goto LAB_00183a3e;
              }
            }
            goto LAB_00183a35;
          }
          if (*(char *)(lVar10 + -1 + uVar21) == '\0') goto LAB_0018349b;
          if (uVar12 == 0) goto LAB_00183a35;
          if (*(char *)(lVar19 + uVar8) != '\0') {
            if (*(char *)((uVar21 - 2) + lVar11) == '\0') {
LAB_001839e7:
              uVar7 = *(uint *)(lVar16 + uVar21 * 4);
LAB_001839eb:
              uVar7 = UFPC::Merge(uVar7,*(uint *)(lVar20 + -8 + uVar21 * 4));
              goto LAB_00183a04;
            }
            if (*(char *)(lVar19 + -1 + uVar21) != '\0') goto LAB_001838f5;
            if ((*(char *)(lVar19 + -2 + uVar21) == '\0') ||
               (*(char *)(lVar14 + -1 + uVar21) == '\0')) goto LAB_00183899;
            if (*(char *)(lVar19 + uVar21) == '\0') {
              cVar2 = *(char *)(lVar14 + uVar21);
              goto joined_r0x00183a2f;
            }
LAB_0018388f:
            uVar7 = *(uint *)(lVar20 + -8 + uVar21 * 4);
            goto LAB_00183be4;
          }
          if ((lVar18 <= (long)(uVar21 + 2)) || (*(char *)(lVar19 + uVar21 + 2) == '\0')) {
            if (*(char *)(lVar19 + uVar21) != '\0') {
              if (*(char *)((uVar21 - 2) + lVar11) != '\0') {
                if (*(char *)(lVar19 + -1 + uVar21) == '\0') goto LAB_0018387f;
                goto LAB_00183901;
              }
              goto LAB_001839e7;
            }
            goto LAB_00183a35;
          }
          if (*(char *)(lVar14 + uVar8) != '\0') {
            if ((*(char *)((uVar21 - 2) + lVar11) == '\0') ||
               ((*(char *)(lVar19 + -1 + uVar21) == '\0' &&
                ((*(char *)(lVar19 + -2 + uVar21) == '\0' ||
                 (*(char *)(lVar14 + -1 + uVar21) == '\0')))))) goto LAB_00183bcb;
            if (*(char *)(lVar19 + uVar21) == '\0') {
              cVar2 = *(char *)(lVar14 + uVar21);
              goto joined_r0x00183995;
            }
            goto LAB_0018388f;
          }
          if (*(char *)(lVar19 + uVar21) == '\0') goto LAB_00183b93;
          if (*(char *)((uVar21 - 2) + lVar11) == '\0') {
LAB_00183c21:
            uVar7 = UFPC::Merge(*(uint *)(lVar16 + uVar21 * 4),*(uint *)(lVar16 + 8 + uVar21 * 4));
            uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
          }
          else {
            if (*(char *)(lVar19 + -1 + uVar21) == '\0') {
              if (*(char *)(lVar19 + -2 + uVar21) != '\0') {
                cVar2 = *(char *)(lVar14 + -1 + uVar21);
                goto joined_r0x00183c16;
              }
              goto LAB_00183c21;
            }
            uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
            uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
          }
          uVar7 = UFPC::Merge(uVar7,uVar13);
          *(uint *)(lVar20 + uVar21 * 4) = uVar7;
        }
        else {
          uVar8 = uVar21 | 1;
          if ((long)uVar8 < lVar18) {
            if (*(char *)(lVar11 + uVar8) != '\0') goto LAB_0018349b;
            if (((long)uVar17 < lVar9) && (*(char *)(lVar10 + uVar8) != '\0')) goto LAB_001837a3;
          }
          *(undefined4 *)(lVar20 + uVar21 * 4) = 0;
        }
      }
      else {
        if (uVar21 == 0) {
LAB_001835c0:
          uVar8 = uVar21 | 1;
          if ((uVar12 == 0) || ((lVar18 <= (long)uVar8 || (*(char *)(lVar19 + uVar8) == '\0')))) {
            if (((long)uVar8 < lVar18) && (*(char *)(lVar11 + uVar8) != '\0')) {
              if ((uVar12 == 0) || (lVar18 <= (long)(uVar21 + 2))) {
                if (uVar12 == 0) goto LAB_001837a3;
              }
              else if (*(char *)(lVar19 + uVar21 + 2) != '\0') {
                if (*(char *)(lVar19 + uVar21) == '\0') {
                  if ((uVar21 != 0) && (*(char *)(lVar19 + -1 + uVar21) != '\0')) {
                    if ((*(char *)(lVar14 + uVar8) != '\0') && (*(char *)(lVar14 + uVar21) != '\0'))
                    {
                      uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                      goto LAB_00183be4;
                    }
                    uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
                    uVar13 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                    goto LAB_00183bd5;
                  }
                }
                else {
LAB_0018364c:
                  if (*(char *)(lVar14 + (uVar21 | 1)) == '\0') {
                    uVar7 = *(uint *)(lVar16 + uVar21 * 4);
                    uVar13 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                    goto LAB_001838b3;
                  }
                }
LAB_00183861:
                uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                goto LAB_00183a3a;
              }
              if (*(char *)(lVar19 + uVar21) != '\0') goto LAB_0018379a;
              if (uVar12 != 0 && uVar21 != 0) {
LAB_001836ec:
                if (*(char *)(lVar19 + -1 + uVar21) != '\0') {
                  uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
                  goto LAB_00183a3a;
                }
              }
            }
            else if (uVar12 != 0) {
              if (*(char *)(lVar19 + uVar21) != '\0') goto LAB_0018379a;
              if (uVar21 != 0) goto LAB_001836ec;
            }
LAB_001837a3:
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar7 = UFPC::length_ + 1;
            *(uint *)(lVar20 + uVar21 * 4) = UFPC::length_;
            UFPC::length_ = uVar7;
            goto LAB_00183a3e;
          }
          if ((((*(char *)(lVar19 + uVar21) == '\0') && (uVar21 != 0)) &&
              (*(char *)(lVar19 + -1 + uVar21) != '\0')) && (*(char *)(lVar14 + uVar21) == '\0')) {
            uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
            uVar13 = *(uint *)(lVar16 + uVar21 * 4);
            goto LAB_001838b3;
          }
LAB_0018379a:
          uVar7 = *(uint *)(lVar16 + uVar21 * 4);
        }
        else if (*(char *)(lVar11 + -1 + uVar21) == '\0') {
          if ((lVar9 <= (long)uVar17) || (*(char *)(lVar10 + -1 + uVar21) == '\0'))
          goto LAB_001835c0;
          uVar8 = uVar21 | 1;
          if (((uVar12 == 0) || (lVar18 <= (long)uVar8)) || (*(char *)(lVar19 + uVar8) == '\0')) {
            if (((lVar18 <= (long)uVar8) || (*(char *)(lVar11 + uVar8) == '\0')) ||
               ((uVar12 == 0 ||
                ((lVar18 <= (long)(uVar21 + 2) || (*(char *)(lVar19 + uVar21 + 2) == '\0')))))) {
              if (uVar12 != 0) {
                if (*(char *)(lVar19 + -1 + uVar21) == '\0') {
                  if (*(char *)(lVar19 + uVar21) != '\0') {
                    if (*(char *)((uVar21 - 2) + lVar11) != '\0') {
LAB_0018387f:
                      cVar2 = *(char *)(lVar19 + -2 + uVar21);
                      goto joined_r0x001833f9;
                    }
                    goto LAB_001838aa;
                  }
                }
                else if (*(char *)((uVar21 - 2) + lVar11) == '\0') {
                  uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
                  goto LAB_001838ae;
                }
              }
              goto LAB_00183a35;
            }
            if (*(char *)((uVar21 - 2) + lVar11) != '\0') {
              if (*(char *)(lVar19 + -1 + uVar21) == '\0') {
                if (*(char *)(lVar14 + uVar8) != '\0') {
                  if ((*(char *)(lVar19 + -2 + uVar21) == '\0') ||
                     (*(char *)(lVar14 + -1 + uVar21) == '\0')) {
                    uVar7 = UFPC::Merge(*(uint *)(lVar16 + 8 + uVar21 * 4),
                                        *(uint *)(lVar20 + -8 + uVar21 * 4));
                  }
                  else {
                    if (*(char *)(lVar19 + uVar21) == '\0') {
                      cVar2 = *(char *)(lVar14 + uVar21);
                      goto joined_r0x00183995;
                    }
                    uVar7 = *(uint *)(lVar20 + -8 + uVar21 * 4);
                  }
                  *(uint *)(lVar20 + uVar21 * 4) = uVar7;
                  goto LAB_00183a3e;
                }
                if (*(char *)(lVar19 + uVar21) != '\0') {
                  if (*(char *)(lVar19 + -2 + uVar21) == '\0') {
                    uVar7 = *(uint *)(lVar16 + uVar21 * 4);
                    goto LAB_00183ba1;
                  }
                  cVar2 = *(char *)(lVar14 + -1 + uVar21);
                  goto joined_r0x00183c16;
                }
              }
              else if (*(char *)(lVar14 + uVar8) != '\0') {
                if (*(char *)(lVar19 + uVar21) == '\0') {
                  cVar2 = *(char *)(lVar14 + uVar21);
joined_r0x00183995:
                  if (cVar2 == '\0') goto LAB_00183b93;
                }
                goto LAB_00183a35;
              }
LAB_00183b93:
              uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
              goto LAB_001838ae;
            }
            if (*(char *)(lVar19 + uVar21) != '\0') {
              cVar2 = *(char *)(lVar14 + uVar8);
joined_r0x00183c16:
              if (cVar2 != '\0') {
LAB_001839b7:
                uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
                goto LAB_001839bc;
              }
              uVar7 = *(uint *)(lVar16 + uVar21 * 4);
LAB_00183b13:
              uVar13 = *(uint *)(lVar16 + 8 + uVar21 * 4);
              goto LAB_00183b18;
            }
            if (*(char *)(lVar19 + -1 + uVar21) == '\0') goto LAB_00183b93;
            if (*(char *)(lVar14 + uVar8) != '\0') {
              if (*(char *)(lVar14 + uVar21) != '\0') goto LAB_001839b7;
              uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
              goto LAB_00183b13;
            }
            uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
LAB_00183ba1:
            uVar7 = UFPC::Merge(uVar7,*(uint *)(lVar16 + 8 + uVar21 * 4));
            uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
          }
          else {
            if (*(char *)((uVar21 - 2) + lVar11) == '\0') {
              if ((*(char *)(lVar19 + uVar21) == '\0') && (*(char *)(lVar19 + -1 + uVar21) != '\0'))
              {
                if (*(char *)(lVar14 + uVar21) == '\0') {
                  uVar7 = *(uint *)(lVar16 + -8 + uVar21 * 4);
                  uVar13 = *(uint *)(lVar16 + uVar21 * 4);
LAB_00183b18:
                  uVar7 = UFPC::Merge(uVar7,uVar13);
                  uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
                }
                else {
                  uVar7 = *(uint *)(lVar16 + uVar21 * 4);
LAB_001839bc:
                  uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
                }
                uVar7 = UFPC::Merge(uVar7,uVar13);
                *(uint *)(lVar20 + uVar21 * 4) = uVar7;
                goto LAB_00183a3e;
              }
            }
            else {
              if (*(char *)(lVar19 + -1 + uVar21) == '\0') {
                if ((*(char *)(lVar19 + -2 + uVar21) == '\0') ||
                   (*(char *)(lVar14 + -1 + uVar21) == '\0')) goto LAB_001839e7;
LAB_001838f5:
                if (*(char *)(lVar19 + uVar21) != '\0') goto LAB_00183901;
                cVar2 = *(char *)(lVar14 + uVar21);
              }
              else {
                if (*(char *)(lVar19 + uVar21) != '\0') goto LAB_00183a35;
                cVar2 = *(char *)(lVar14 + uVar21);
              }
joined_r0x00183a2f:
              if (cVar2 != '\0') goto LAB_00183a35;
            }
LAB_001838aa:
            uVar7 = *(uint *)(lVar16 + uVar21 * 4);
LAB_001838ae:
            uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
          }
LAB_001838b3:
          uVar7 = UFPC::Merge(uVar7,uVar13);
        }
        else {
          uVar8 = uVar21 | 1;
          if (((uVar12 == 0) || (lVar18 <= (long)uVar8)) || (*(char *)(lVar19 + uVar8) == '\0')) {
            if ((((long)uVar8 < lVar18) && (*(char *)(lVar11 + uVar8) != '\0')) &&
               ((uVar12 != 0 &&
                (((long)(uVar21 + 2) < lVar18 && (*(char *)(lVar19 + uVar21 + 2) != '\0')))))) {
              if (*(char *)(lVar14 + uVar8) != '\0') {
                if (*(char *)(lVar19 + uVar21) != '\0') goto LAB_0018388f;
LAB_00183526:
                if ((*(char *)(lVar14 + uVar21) != '\0') &&
                   ((*(char *)(lVar19 + -1 + uVar21) != '\0' ||
                    ((*(char *)((uVar21 - 2) + lVar19) != '\0' &&
                     (*(char *)(lVar14 + -1 + uVar21) != '\0')))))) goto LAB_0018388f;
              }
LAB_00183bcb:
              uVar7 = *(uint *)(lVar16 + 8 + uVar21 * 4);
              goto LAB_00183bd0;
            }
          }
          else {
LAB_001833d0:
            if (*(char *)(lVar19 + uVar21) == '\0') {
              if (*(char *)(lVar14 + uVar21) != '\0') {
                if (*(char *)(lVar19 + -1 + uVar21) != '\0') goto LAB_0018388f;
                cVar2 = *(char *)((uVar21 - 2) + lVar19);
joined_r0x001833f9:
                if ((cVar2 != '\0') && (*(char *)(lVar14 + -1 + uVar21) != '\0')) goto LAB_0018388f;
              }
LAB_00183899:
              uVar7 = *(uint *)(lVar16 + uVar21 * 4);
LAB_00183bd0:
              uVar13 = *(uint *)(lVar20 + -8 + uVar21 * 4);
LAB_00183bd5:
              uVar7 = UFPC::Merge(uVar7,uVar13);
LAB_00183be4:
              *(uint *)(lVar20 + uVar21 * 4) = uVar7;
              goto LAB_00183a3e;
            }
          }
LAB_00183a35:
          uVar7 = *(uint *)(lVar20 + -8 + uVar21 * 4);
        }
LAB_00183a3a:
        *(uint *)(lVar20 + uVar21 * 4) = uVar7;
      }
LAB_00183a3e:
    }
  }
  uVar7 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
  puVar5 = UFPC::P_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar7 = *(uint *)&pMVar4->field_0x8;
  local_c0 = *(uint *)&pMVar4->field_0xc & 0x80000001;
  uVar12 = (long)(int)*(uint *)&pMVar4->field_0xc & 0xfffffffffffffffe;
  lVar9 = 1;
  lVar18 = 0;
  do {
    puVar6 = UFPC::P_;
    if ((long)((long)(int)uVar7 & 0xfffffffffffffffeU) <= lVar18) {
      if ((uVar7 & 0x80000001) == 1) {
        lVar10 = **(long **)&pMVar3->field_0x48 * lVar18 + *(long *)&pMVar3->field_0x10;
        lVar9 = lVar18 * **(long **)&pMVar4->field_0x48 + *(long *)&pMVar4->field_0x10;
        for (lVar18 = 0; lVar18 < (long)uVar12; lVar18 = lVar18 + 2) {
          lVar16 = (long)*(int *)(lVar9 + lVar18 * 4);
          if (lVar16 < 1) {
            *(undefined8 *)(lVar9 + lVar18 * 4) = 0;
          }
          else {
            uVar7 = puVar6[lVar16];
            uVar13 = uVar7;
            if (*(char *)(lVar10 + lVar18) == '\0') {
              uVar13 = 0;
            }
            *(uint *)(lVar9 + lVar18 * 4) = uVar13;
            if (*(char *)(lVar10 + 1 + lVar18) == '\0') {
              *(undefined4 *)(lVar9 + 4 + lVar18 * 4) = 0;
            }
            else {
              *(uint *)(lVar9 + 4 + lVar18 * 4) = uVar7;
            }
          }
        }
        if (local_c0 == 1) {
          lVar16 = (long)*(int *)(lVar9 + lVar18 * 4);
          uVar7 = 0;
          if ((0 < lVar16) && (uVar7 = 0, *(char *)(lVar18 + lVar10) != '\0')) {
            uVar7 = UFPC::P_[lVar16];
          }
          *(uint *)(lVar9 + lVar18 * 4) = uVar7;
        }
      }
      UFPC::Dealloc();
      return;
    }
    lVar10 = **(long **)&pMVar4->field_0x48;
    lVar19 = lVar10 * lVar18 + *(long *)&pMVar4->field_0x10;
    lVar14 = lVar10 * lVar9 + *(long *)&pMVar4->field_0x10;
    lVar11 = **(long **)&pMVar3->field_0x48 * lVar9 + *(long *)&pMVar3->field_0x10;
    lVar16 = **(long **)&pMVar3->field_0x48 * lVar18 + *(long *)&pMVar3->field_0x10;
    for (uVar17 = 0; (long)uVar17 < (long)uVar12; uVar17 = uVar17 + 2) {
      lVar20 = (long)*(int *)(lVar19 + uVar17 * 4);
      if (lVar20 < 1) {
        *(undefined8 *)(lVar19 + uVar17 * 4) = 0;
        uVar21 = uVar17 | 1;
        *(undefined4 *)(lVar14 + uVar17 * 4) = 0;
        uVar13 = 0;
      }
      else {
        uVar13 = puVar6[lVar20];
        uVar15 = uVar13;
        if (*(char *)(lVar16 + uVar17) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar19 + uVar17 * 4) = uVar15;
        uVar15 = uVar13;
        if (*(char *)(lVar16 + 1 + uVar17) == '\0') {
          uVar15 = 0;
        }
        uVar21 = uVar17 + 1;
        *(uint *)(lVar19 + 4 + uVar17 * 4) = uVar15;
        uVar15 = uVar13;
        if (*(char *)(lVar11 + uVar17) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar14 + uVar17 * 4) = uVar15;
        if (*(char *)(lVar11 + 1 + uVar17) == '\0') {
          uVar13 = 0;
        }
      }
      *(uint *)(lVar19 + lVar10 + uVar21 * 4) = uVar13;
    }
    if (local_c0 == 1) {
      lVar10 = (long)*(int *)(lVar19 + uVar17 * 4);
      if (lVar10 < 1) {
        *(undefined4 *)(lVar19 + uVar17 * 4) = 0;
      }
      else {
        uVar13 = puVar5[lVar10];
        uVar15 = uVar13;
        if (*(char *)(uVar17 + lVar16) == '\0') {
          uVar15 = 0;
        }
        *(uint *)(lVar19 + uVar17 * 4) = uVar15;
        if (*(char *)(uVar17 + lVar11) != '\0') {
          *(uint *)(lVar14 + uVar17 * 4) = uVar13;
          goto LAB_00183dcc;
        }
      }
      *(undefined4 *)(lVar14 + uVar17 * 4) = 0;
    }
LAB_00183dcc:
    lVar18 = lVar18 + 2;
    lVar9 = lVar9 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only matter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }